

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::createTextureToTestShaderStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  uint width;
  GLenum GVar2;
  GLint i;
  ulong uVar3;
  GLuint texture_id;
  vector<int,_std::allocator<int>_> texture_data;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetError(this_00);
  width = getMaximumImageUniformsForStage(this,stage);
  texture_id = 0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (1 < (int)width) {
    glu::CallLogWrapper::glGenTextures(this_00,1,&texture_id);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x23a9);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture_id);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
      glu::checkError(GVar2,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x23b1);
    }
    std::vector<int,_std::allocator<int>_>::resize(&texture_data,(long)(int)(width * 2));
    for (uVar3 = 0; width != uVar3; uVar3 = uVar3 + 1) {
      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = (int)uVar3 + 0x40104200;
      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)(width + (int)uVar3)] = 0;
    }
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8235,width,2,0,0x8d94,0x1404,
               texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
      glu::checkError(GVar2,"TexImage2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x23c3);
    }
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x813c,0);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x813d,0);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture_id);
      glu::checkError(GVar2,"TexParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                      ,0x23ce);
    }
  }
  GVar1 = texture_id;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&texture_data.super__Vector_base<int,_std::allocator<int>_>);
  return GVar1;
}

Assistant:

GLuint createTextureToTestShaderStage(shaderStage stage)
	{
		GLenum			   error			  = glGetError();
		const GLint		   max_image_uniforms = getMaximumImageUniformsForStage(stage);
		GLuint			   texture_id		  = 0;
		std::vector<GLint> texture_data;

		const GLsizei height = 2;
		const GLsizei width  = max_image_uniforms;

		if (m_min_required_image_uniforms > max_image_uniforms)
		{
			return 0;
		}

		/* Generate texture id */
		glGenTextures(1, &texture_id);
		GLU_EXPECT_NO_ERROR(glGetError(), "GenTextures");

		/* Bind texture */
		glBindTexture(GL_TEXTURE_2D, texture_id);
		error = glGetError();
		if (GL_NO_ERROR != error)
		{
			glDeleteTextures(1, &texture_id);
			GLU_EXPECT_NO_ERROR(error, "BindTexture");
		}

		/* Prepare storage for texture data */
		texture_data.resize(width * height);
		for (GLint i = 0; i < max_image_uniforms; ++i)
		{
			texture_data[i]			= getExpectedValue(i);
			texture_data[i + width] = 0;
		}

		/* Create first level of texture */
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_R32I, width, height, 0 /*border */, GL_RED_INTEGER, GL_INT,
					 &texture_data[0]);
		error = glGetError();
		if (GL_NO_ERROR != error)
		{
			glDeleteTextures(1, &texture_id);
			GLU_EXPECT_NO_ERROR(error, "TexImage2D");
		}

		/* Make texture complete */
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		error = glGetError();
		if (GL_NO_ERROR != error)
		{
			glDeleteTextures(1, &texture_id);
			GLU_EXPECT_NO_ERROR(error, "TexParameteri");
		}

		/* Done */
		return texture_id;
	}